

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O0

string * __thiscall
lest::to_string<nonstd::sv_lite::basic_string_view<char,std::char_traits<char>>,char[6]>
          (string *__return_storage_ptr__,lest *this,
          basic_string_view<char,_std::char_traits<char>_> *lhs,string *op,char (*rhs) [6])

{
  ostream *poVar1;
  char **txt;
  basic_string_view<char,_std::char_traits<char>_> v;
  string local_238 [32];
  string *local_218;
  string local_210;
  allocator<char> local_1d9;
  sv_lite *local_1d8;
  const_pointer pcStack_1d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c0;
  ostringstream local_1a0 [8];
  ostringstream os;
  char (*rhs_local) [6];
  string *op_local;
  basic_string_view<char,_std::char_traits<char>_> *lhs_local;
  
  std::__cxx11::ostringstream::ostringstream(local_1a0);
  local_1d8 = *(sv_lite **)this;
  pcStack_1d0 = *(const_pointer *)(this + 8);
  std::allocator<char>::allocator();
  v.size_ = (size_type)&local_1d9;
  v.data_ = pcStack_1d0;
  nonstd::sv_lite::to_string<char,std::char_traits<char>,std::allocator<char>>
            (&local_1c0,local_1d8,v,(allocator<char> *)rhs);
  poVar1 = std::operator<<((ostream *)local_1a0,(string *)&local_1c0);
  poVar1 = std::operator<<(poVar1," ");
  poVar1 = std::operator<<(poVar1,(string *)lhs);
  poVar1 = std::operator<<(poVar1," ");
  local_218 = op;
  to_string_abi_cxx11_(&local_210,(lest *)&local_218,txt);
  std::operator<<(poVar1,(string *)&local_210);
  std::__cxx11::string::~string((string *)&local_210);
  std::__cxx11::string::~string((string *)&local_1c0);
  std::allocator<char>::~allocator(&local_1d9);
  std::__cxx11::ostringstream::str();
  std::__cxx11::string::string((string *)__return_storage_ptr__,local_238);
  std::__cxx11::string::~string(local_238);
  std::__cxx11::ostringstream::~ostringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

std::string to_string( L const & lhs, std::string op, R const & rhs )
{
    std::ostringstream os; os << to_string( lhs ) << " " << op << " " << to_string( rhs ); return os.str();
}